

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QControlledGate2<double>::apply
          (QControlledGate2<double> *this,Op op,int nbQubits,
          vector<double,_std::allocator<double>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_40_5_d6c92a71 f;
  SquareMatrix<double> local_80;
  int *local_70 [2];
  long local_60;
  anon_class_40_5_d6c92a71 local_58;
  
  (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[5])(local_70,this);
  *(ulong *)local_70[0] =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)local_70[0] >> 0x20),
                offset + (int)*(undefined8 *)local_70[0]);
  iVar1 = this->control_;
  iVar2 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0xf])(this);
  iVar3 = (*(this->super_QGate2<double>).super_QObject<double>._vptr_QObject[0x10])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
            (&local_80,(long *)CONCAT44(extraout_var,iVar3));
  lambda_QGate1<double>
            (&local_58,op,&local_80,
             (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start);
  if (local_80.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_80.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_80.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  apply4<qclab::qgates::lambda_QGate1<double>(qclab::Op,qclab::dense::SquareMatrix<double>,double*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_70[0],local_70[0][1],iVar1 + offset,iVar2 + offset,this->controlState_,
             &local_58);
  if (local_70[0] != (int *)0x0) {
    operator_delete(local_70[0],local_60 - (long)local_70[0]);
  }
  return;
}

Assistant:

void QControlledGate2< T >::apply( Op op ,
                                     const int nbQubits ,
                                     std::vector< T >& vector ,
                                     const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_QGate1( op , this->gate()->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }